

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.cc
# Opt level: O0

void BF_cfb64_encrypt(uchar *in,uchar *out,long length,BF_KEY *schedule,uchar *ivec,int *num,int enc
                     )

{
  byte bVar1;
  byte bVar2;
  uint32_t auVar3 [2];
  uint8_t *iv;
  uint local_58;
  uint8_t cc;
  uint uStack_54;
  uint8_t c;
  uint32_t ti [2];
  size_t l;
  int n;
  uint32_t t;
  uint32_t v1;
  uint32_t v0;
  int *num_local;
  uint8_t *ivec_local;
  BF_KEY *schedule_local;
  size_t length_local;
  uint8_t *out_local;
  uint8_t *in_local;
  
  l._0_4_ = *num;
  ti = (uint32_t  [2])length;
  length_local = (size_t)out;
  out_local = in;
  if (enc == 0) {
    while (auVar3 = (uint32_t  [2])((long)ti + -1), ti != (uint32_t  [2])0x0) {
      ti = auVar3;
      if ((uint)l == 0) {
        local_58 = (uint)ivec[3] | (uint)ivec[2] << 8 | (uint)ivec[1] << 0x10 | (uint)*ivec << 0x18;
        uStack_54 = (uint)ivec[7] |
                    (uint)ivec[6] << 8 | (uint)ivec[5] << 0x10 | (uint)ivec[4] << 0x18;
        BF_encrypt(&local_58,schedule);
        *ivec = (uchar)(local_58 >> 0x18);
        ivec[1] = (uchar)(local_58 >> 0x10);
        ivec[2] = (uchar)(local_58 >> 8);
        ivec[3] = (uchar)local_58;
        ivec[4] = (uchar)(uStack_54 >> 0x18);
        ivec[5] = (uchar)(uStack_54 >> 0x10);
        ivec[6] = (uchar)(uStack_54 >> 8);
        ivec[7] = (uchar)uStack_54;
      }
      bVar1 = *out_local;
      bVar2 = ivec[(int)(uint)l];
      ivec[(int)(uint)l] = bVar1;
      *(byte *)length_local = bVar2 ^ bVar1;
      l._0_4_ = (uint)l + 1 & 7;
      length_local = length_local + 1;
      out_local = out_local + 1;
    }
  }
  else {
    while (auVar3 = (uint32_t  [2])((long)ti + -1), ti != (uint32_t  [2])0x0) {
      ti = auVar3;
      if ((uint)l == 0) {
        local_58 = (uint)ivec[3] | (uint)ivec[2] << 8 | (uint)ivec[1] << 0x10 | (uint)*ivec << 0x18;
        uStack_54 = (uint)ivec[7] |
                    (uint)ivec[6] << 8 | (uint)ivec[5] << 0x10 | (uint)ivec[4] << 0x18;
        BF_encrypt(&local_58,schedule);
        *ivec = (uchar)(local_58 >> 0x18);
        ivec[1] = (uchar)(local_58 >> 0x10);
        ivec[2] = (uchar)(local_58 >> 8);
        ivec[3] = (uchar)local_58;
        ivec[4] = (uchar)(uStack_54 >> 0x18);
        ivec[5] = (uchar)(uStack_54 >> 0x10);
        ivec[6] = (uchar)(uStack_54 >> 8);
        ivec[7] = (uchar)uStack_54;
      }
      bVar1 = *out_local;
      bVar2 = ivec[(int)(uint)l];
      *(byte *)length_local = bVar1 ^ bVar2;
      ivec[(int)(uint)l] = bVar1 ^ bVar2;
      l._0_4_ = (uint)l + 1 & 7;
      length_local = length_local + 1;
      out_local = out_local + 1;
    }
  }
  *num = (uint)l;
  return;
}

Assistant:

static void BF_cfb64_encrypt(const uint8_t *in, uint8_t *out, size_t length,
                             const BF_KEY *schedule, uint8_t *ivec, int *num,
                             int encrypt) {
  uint32_t v0, v1, t;
  int n = *num;
  size_t l = length;
  uint32_t ti[2];
  uint8_t c, cc;

  uint8_t *iv = ivec;
  if (encrypt) {
    while (l--) {
      if (n == 0) {
        n2l(iv, v0);
        ti[0] = v0;
        n2l(iv, v1);
        ti[1] = v1;
        BF_encrypt(ti, schedule);
        iv = ivec;
        t = ti[0];
        l2n(t, iv);
        t = ti[1];
        l2n(t, iv);
        iv = ivec;
      }
      c = *(in++) ^ iv[n];
      *(out++) = c;
      iv[n] = c;
      n = (n + 1) & 0x07;
    }
  } else {
    while (l--) {
      if (n == 0) {
        n2l(iv, v0);
        ti[0] = v0;
        n2l(iv, v1);
        ti[1] = v1;
        BF_encrypt(ti, schedule);
        iv = ivec;
        t = ti[0];
        l2n(t, iv);
        t = ti[1];
        l2n(t, iv);
        iv = ivec;
      }
      cc = *(in++);
      c = iv[n];
      iv[n] = cc;
      *(out++) = c ^ cc;
      n = (n + 1) & 0x07;
    }
  }

  *num = n;
}